

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.h
# Opt level: O1

size_t bitset_next_set_bits(bitset_t *bitset,size_t *buffer,size_t capacity,size_t *startfrom)

{
  uint64_t *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  size_t sVar5;
  ulong uVar6;
  
  if (capacity != 0) {
    uVar3 = *startfrom;
    sVar5 = uVar3 >> 6;
    if (sVar5 < bitset->arraysize) {
      puVar1 = bitset->array;
      uVar4 = puVar1[sVar5] >> ((byte)uVar3 & 0x3f);
      uVar3 = uVar3 & 0xffffffffffffffc0;
      uVar2 = 0;
      do {
        while (uVar4 == 0) {
          sVar5 = sVar5 + 1;
          uVar6 = uVar2;
          if (sVar5 == bitset->arraysize) goto LAB_001067db;
          uVar3 = uVar3 + 0x40;
          uVar4 = puVar1[sVar5];
          if (capacity <= uVar2) goto LAB_001067db;
        }
        uVar6 = 0;
        if (uVar4 != 0) {
          for (; (uVar4 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
          }
        }
        buffer[uVar2] = uVar6 | uVar3;
        uVar6 = uVar4 - 1;
        if (capacity - 1 == uVar2) {
          uVar6 = 0xffffffffffffffff;
        }
        uVar2 = uVar2 + 1;
        uVar4 = uVar4 & uVar6;
        uVar6 = capacity;
      } while (capacity != uVar2);
LAB_001067db:
      if (uVar6 != 0) {
        *startfrom = buffer[uVar6 - 1];
      }
      return uVar6;
    }
  }
  return 0;
}

Assistant:

inline size_t bitset_next_set_bits(const bitset_t *bitset, size_t *buffer,
                                   size_t capacity, size_t *startfrom) {
    if (capacity == 0) return 0;  // sanity check
    size_t x = *startfrom / 64;
    if (x >= bitset->arraysize) {
        return 0;  // nothing more to iterate over
    }
    uint64_t w = bitset->array[x];
    w >>= (*startfrom & 63);
    size_t howmany = 0;
    size_t base = x << 6;
    while (howmany < capacity) {
        while (w != 0) {
            uint64_t t = w & (~w + 1);
            int r = roaring_trailing_zeroes(w);
            buffer[howmany++] = r + base;
            if (howmany == capacity) goto end;
            w ^= t;
        }
        x += 1;
        if (x == bitset->arraysize) {
            break;
        }
        base += 64;
        w = bitset->array[x];
    }
end:
    if (howmany > 0) {
        *startfrom = buffer[howmany - 1];
    }
    return howmany;
}